

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_timer.cpp
# Opt level: O0

void KokkosTools::KernelTimer::kokkosp_pop_profile_region(void)

{
  ostream *poVar1;
  string *psVar2;
  char *local_18;
  int local_c;
  int i;
  
  current_region_level = current_region_level + -1;
  if (current_region_level < 0) {
    current_region_level = 0;
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "WARNING:: Kokkos::Profiling::popRegion() called outside ");
    std::operator<<(poVar1," of an actve region. Previous regions: ");
    local_c = 0;
    while ((local_c < 5 && (*(long *)(regions + (long)local_c * 8) != 0))) {
      if (local_c == 0) {
        local_18 = " ";
      }
      else {
        local_18 = ";";
      }
      poVar1 = std::operator<<((ostream *)&std::cerr,local_18);
      psVar2 = KernelPerformanceInfo::getName_abi_cxx11_
                         (*(KernelPerformanceInfo **)(regions + (long)local_c * 8));
      std::operator<<(poVar1,(string *)psVar2);
      local_c = local_c + 1;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
  }
  else {
    KernelPerformanceInfo::addFromTimer
              (*(KernelPerformanceInfo **)(regions + (long)current_region_level * 8));
  }
  return;
}

Assistant:

void kokkosp_pop_profile_region() {
  current_region_level--;

  // current_region_level is out of bounds, inform the user they
  // called popRegion too many times.
  if (current_region_level < 0) {
    current_region_level = 0;
    std::cerr << "WARNING:: Kokkos::Profiling::popRegion() called outside "
              << " of an actve region. Previous regions: ";

    /* This code block will walk back through the non-null regions
     * pointers and print the names.  This takes advantage of a slight
     * issue with regions logic: we never actually delete the
     * KernelPerformanceInfo objects.  If that ever changes this needs
     * to be updated.
     */
    for (int i = 0; i < 5; i++) {
      if (regions[i] != 0) {
        std::cerr << (i == 0 ? " " : ";") << regions[i]->getName();
      } else {
        break;
      }
    }
    std::cerr << "\n";
  } else {
    // don't call addFromTimer if we are outside an active region
    regions[current_region_level]->addFromTimer();
  }
}